

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void testTinySVDImp<double>(void)

{
  Vec3<double> *in_stack_fffffffffffffa20;
  Vec3<double> *in_stack_fffffffffffffa28;
  Vec4<double> *in_stack_fffffffffffffa60;
  Vec4<double> *in_stack_fffffffffffffa68;
  double in_stack_fffffffffffffa70;
  double in_stack_fffffffffffffa78;
  double in_stack_fffffffffffffa80;
  double in_stack_fffffffffffffa88;
  double in_stack_fffffffffffffa90;
  double in_stack_fffffffffffffa98;
  double in_stack_fffffffffffffaa0;
  double in_stack_fffffffffffffab0;
  double in_stack_fffffffffffffad8;
  double in_stack_fffffffffffffae0;
  double in_stack_fffffffffffffae8;
  double in_stack_fffffffffffffaf0;
  double in_stack_fffffffffffffaf8;
  double in_stack_fffffffffffffb00;
  double in_stack_fffffffffffffb08;
  Matrix33<double> *in_stack_fffffffffffffb10;
  double in_stack_fffffffffffffb20;
  double in_stack_fffffffffffffb28;
  double in_stack_fffffffffffffb30;
  double in_stack_fffffffffffffb38;
  double in_stack_fffffffffffffb40;
  double in_stack_fffffffffffffb48;
  double in_stack_fffffffffffffb50;
  double in_stack_fffffffffffffb58;
  Matrix44<double> *in_stack_fffffffffffffbb0;
  Vec4<double> local_3a8;
  Vec4<double> local_388 [5];
  Vec4<double> local_2e8;
  Vec4<double> local_2c8 [5];
  Vec3<double> local_228;
  Vec3<double> local_210 [4];
  Vec3<double> local_1b0;
  Vec3<double> local_198 [7];
  Vec3<double> local_f0;
  Vec3<double> local_d8 [4];
  Vec3<double> local_78;
  Vec3<double> local_60 [4];
  
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  Imath_3_2::Vec3<double>::Vec3(local_60,100.0,1e-05,0.0);
  Imath_3_2::Vec3<double>::Vec3(&local_78,100.0,1e-05,0.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  testTinySVD_3x3<double>(in_stack_fffffffffffffb10);
  Imath_3_2::Vec3<double>::Vec3(local_d8,245.0,20.0,1.0);
  Imath_3_2::Vec3<double>::Vec3(&local_f0,256.0,300.0,20.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  testTinySVD_3x3<double>(in_stack_fffffffffffffb10);
  Imath_3_2::Vec3<double>::Vec3(local_198,245.0,20.0,1.0);
  Imath_3_2::Vec3<double>::Vec3(&local_1b0,245.0,20.0,1.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  Imath_3_2::Vec3<double>::Vec3(local_210,1.0,2.0,3.0);
  Imath_3_2::Vec3<double>::Vec3(&local_228,1.0,2.0,3.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  Imath_3_2::Matrix33<double>::operator+
            ((Matrix33<double> *)in_stack_fffffffffffffa28,
             (Matrix33<double> *)in_stack_fffffffffffffa20);
  testTinySVD_3x3<double>(in_stack_fffffffffffffb10);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_3x3<double>
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             in_stack_fffffffffffffa70,(double)in_stack_fffffffffffffa68,in_stack_fffffffffffffab0);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  testTinySVD_4x4<double>
            ((double)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffb20,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb58);
  Imath_3_2::Vec4<double>::Vec4(local_2c8,100.0,1e-05,0.0,0.0);
  Imath_3_2::Vec4<double>::Vec4(&local_2e8,100.0,1e-05,0.0,0.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  testTinySVD_4x4<double>(in_stack_fffffffffffffbb0);
  Imath_3_2::Vec4<double>::Vec4(local_388,245.0,20.0,1.0,0.5);
  Imath_3_2::Vec4<double>::Vec4(&local_3a8,256.0,300.0,20.0,10.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  testTinySVD_4x4<double>(in_stack_fffffffffffffbb0);
  Imath_3_2::Vec4<double>::Vec4((Vec4<double> *)&stack0xfffffffffffffb38,245.0,20.0,1.0,0.5);
  Imath_3_2::Vec4<double>::Vec4((Vec4<double> *)&stack0xfffffffffffffb18,256.0,300.0,20.0,10.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  Imath_3_2::Vec4<double>::Vec4((Vec4<double> *)&stack0xfffffffffffffa78,30.0,10.0,10.0,10.0);
  Imath_3_2::Vec4<double>::Vec4((Vec4<double> *)&stack0xfffffffffffffa58,1.0,2.0,3.0,3.0);
  Imath_3_2::outerProduct<double>(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  Imath_3_2::Matrix44<double>::operator+
            ((Matrix44<double> *)in_stack_fffffffffffffa68,
             (Matrix44<double> *)in_stack_fffffffffffffa60);
  testTinySVD_4x4<double>(in_stack_fffffffffffffbb0);
  return;
}

Assistant:

void
testTinySVDImp ()
{
    // Try a bunch of 3x3 matrices:
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 1);
    testTinySVD_3x3<T> (1, 0, 0, 0, -1, 0, 0, 0, 1);
    testTinySVD_3x3<T> (0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (0, 0, 0, 0, 0, 0, 0, 0, 1);
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, T(1e-10), 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, T(1e-10), 0, 0, 0, 0, 100000);
    testTinySVD_3x3<T> (1, 2, 3, 4, 5, 6, 7, 8, 9);
    testTinySVD_3x3<T> (1, 2, 3, 4, 5, 6, 7, 8, 9);
    testTinySVD_3x3<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (100, T(1e-5), 0),
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (100, T(1e-5), 0)));
    testTinySVD_3x3<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1),
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (256, 300, 20)));
    testTinySVD_3x3<T> (
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1),
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1)) +
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 2, 3),
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 2, 3)));

    // Some problematic matrices from SVDTest:
    testTinySVD_3x3<T> (
        T(0.0023588321752040036),
        T(-0.0096558131480729038),
        T(0.0010959850449366493),
        T(0.0088671829608044754),
        T(0.0016771794267033666),
        T(-0.0043081475729438235),
        T(0.003976050440932701),
        T(0.0019880497026345716),
        T(0.0089576046614601966));
    testTinySVD_3x3<T> (
        T(2.3588321752040035e-09),
        T(-9.6558131480729038e-09),
        T(1.0959850449366498e-09),
        T(8.8671829608044748e-09),
        T(1.6771794267033661e-09),
        T(-4.3081475729438225e-09),
        T(3.9760504409327016e-09),
        T(1.9880497026345722e-09),
        T(8.9576046614601957e-09));
    testTinySVD_3x3<T> (
        T(-0.46673855799602715),
        T(0.67466260360310948),
        T(0.97646986796448998),
        T(-0.032460753747103721),
        T(0.046584527749418278),
        T(0.067431228641151142),
        T(-0.088885055229687815),
        T(0.1280389179308779),
        T(0.18532617511453064));
    testTinySVD_3x3<T> (T(1e-8), 0, 0, 0, T(1e-8), 0, 0, 0, T(1e-8));
    testTinySVD_3x3<T> (1, 0, 0, 0, T(.00036), 0, T(1e-18), 0, T(.00018));
    testTinySVD_3x3<T> (T(1.3), 0, 0, 0, T(.0003), 0, T(1e-17), 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, T(1e-2), 0, 0, 0, T(1e-2));
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, T(1e-3), 0, 0, 0, T(1e-6));
    testTinySVD_3x3<T> (
        T(0.59588638570136332),
        T(-0.79761234126107794),
        -1,
        T(0.39194500425202045),
        T(0.91763115383440363),
        T(-0.341818175044664),
        T(-0.45056075218951946),
        T(-0.71259057727425101),
        T(0.47125008216720271));
    testTinySVD_3x3<T> (
        T(4.38805348e-09),
        T(-2.53189691e-09),
        T(-4.65678607e-09),
        T(-3.23000099e-10),
        T(1.86370294e-10),
        T(3.42781192e-10),
        T(-4.61572824e-09),
        T(2.6632645e-09),
        T(4.89840346e-09));
    // problematic 2x2 one for lapack on suse (see below), padded with 0's
    testTinySVD_3x3<T> (0, T(-1.00000003e-22), 0, T(1.00000001e-07), 0, 0, 0, 0, 0);
    // problematic 2x2 one for lapack on suse (see below), padded with 0's and 1
    testTinySVD_3x3<T> (0, T(-1.00000003e-22), 0, T(1.00000001e-07), 0, 0, 0, 0, 1);

    // Now, 4x4 matrices:
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, -1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16);
    testTinySVD_4x4<T> (
        0,
        T(-1.00000003e-22),
        0,
        0,
        T(00000001e-07),
        0,
        0,
        0,
        0,
        0,
        1,
        0,
        0,
        0,
        0,
        1);
    testTinySVD_4x4<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (100, T(1e-5), 0, 0),
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (100, T(1e-5), 0, 0)));
    testTinySVD_4x4<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (245, 20, 1, T(0.5)),
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (256, 300, 20, 10)));
    testTinySVD_4x4<T> (
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (245, 20, 1, T(0.5)),
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (256, 300, 20, 10)) +
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (30, 10, 10, 10),
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (1, 2, 3, 3)));
}